

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioStoreScript(char *script)

{
  FILE *pFVar1;
  char *pcVar2;
  pthread_t *ppVar3;
  long lVar4;
  undefined8 in_RDI;
  void *in_stack_00000020;
  int i;
  int slot;
  int status;
  gpioScript_t *s;
  int in_stack_0001021c;
  cmdScript_t *in_stack_00010220;
  char *in_stack_00010228;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: script=[%s]\n",pcVar2,"gpioStoreScript",in_RDI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioStoreScript"
             );
    }
    local_4 = 0xffffffe1;
  }
  else {
    local_20 = 0xffffffff;
    pthread_mutex_lock((pthread_mutex_t *)&gpioStoreScript::mutex);
    for (local_24 = 0; (int)local_24 < 0x20; local_24 = local_24 + 1) {
      if (gpioScript[(int)local_24].state == 0) {
        local_20 = local_24;
        gpioScript[(int)local_24].state = 1;
        break;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gpioStoreScript::mutex);
    pFVar1 = _stderr;
    if ((int)local_20 < 0) {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: no room for scripts\n",pcVar2,"gpioStoreScript");
      }
      local_4 = 0xffffffc7;
    }
    else {
      lVar4 = (long)(int)local_20;
      local_1c = cmdParseScript(in_stack_00010228,in_stack_00010220,in_stack_0001021c);
      if (local_1c == 0) {
        gpioScript[lVar4].request = 0;
        gpioScript[lVar4].run_state = 0;
        pthread_cond_init((pthread_cond_t *)&gpioScript[lVar4].pthCond,(pthread_condattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)&gpioScript[lVar4].pthMutex,(pthread_mutexattr_t *)0x0
                          );
        gpioScript[lVar4].id = local_20;
        gpioScript[(int)local_20].state = 2;
        ppVar3 = gpioStartThread(_slot,in_stack_00000020);
        gpioScript[lVar4].pthIdp = ppVar3;
        local_1c = local_20;
      }
      else {
        if (gpioScript[lVar4].script.par != (int *)0x0) {
          free(gpioScript[lVar4].script.par);
        }
        gpioScript[lVar4].script.par = (int *)0x0;
        gpioScript[(int)local_20].state = 0;
      }
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

int gpioStoreScript(char *script)
{
   static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
   gpioScript_t *s;
   int status, slot, i;

   DBG(DBG_USER, "script=[%s]", script);

   CHECK_INITED;

   slot = -1;

   pthread_mutex_lock(&mutex);

   for (i=0; i<PI_MAX_SCRIPTS; i++)
   {
      if (gpioScript[i].state == PI_SCRIPT_FREE)
      {
         slot = i;
         gpioScript[slot].state = PI_SCRIPT_RESERVED;
         break;
      }
   }

   pthread_mutex_unlock(&mutex);

   if (slot < 0) SOFT_ERROR(PI_NO_SCRIPT_ROOM, "no room for scripts");

   s = &gpioScript[slot];

   status = cmdParseScript(script, &s->script, 0);

   if (status == 0)
   {
      s->request   = PI_SCRIPT_HALT;
      s->run_state = PI_SCRIPT_INITING;

      pthread_cond_init(&s->pthCond, NULL);
      pthread_mutex_init(&s->pthMutex, NULL);

      s->id = slot;

      gpioScript[slot].state = PI_SCRIPT_IN_USE;

      s->pthIdp = gpioStartThread(pthScript, s);

      status = slot;
   }
   else
   {
      if (s->script.par) free(s->script.par);
      s->script.par = NULL;
      gpioScript[slot].state = PI_SCRIPT_FREE;
   }

   return status;
}